

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O2

xmlChar * xmlNodeListGetStringInternal(xmlDocPtr doc,xmlNode *node,int escMode)

{
  xmlBufPtr buf;
  xmlChar *pxVar1;
  uint flags;
  
  if (((escMode == 0) && (node->type - XML_TEXT_NODE < 2)) && (node->next == (_xmlNode *)0x0)) {
    pxVar1 = node->content;
    if (pxVar1 == (xmlChar *)0x0) {
      pxVar1 = "";
    }
    pxVar1 = xmlStrdup(pxVar1);
    return pxVar1;
  }
  buf = xmlBufCreate(0x32);
  if (buf == (xmlBufPtr)0x0) {
LAB_00146bc6:
    pxVar1 = (xmlChar *)0x0;
  }
  else {
    for (; node != (xmlNode *)0x0; node = node->next) {
      if (node->type - XML_TEXT_NODE < 2) {
        pxVar1 = node->content;
        if (pxVar1 != (xmlChar *)0x0) {
          if (escMode == 0) {
            xmlBufCat(buf,pxVar1);
          }
          else {
            if (escMode == 2) {
              flags = 1;
LAB_00146b72:
              pxVar1 = xmlEncodeEntitiesInternal(doc,pxVar1,flags);
            }
            else {
              if (escMode == 1) {
                flags = 0;
                goto LAB_00146b72;
              }
              pxVar1 = xmlEncodeSpecialChars(doc,pxVar1);
            }
            if (pxVar1 == (xmlChar *)0x0) {
              xmlBufFree(buf);
              goto LAB_00146bc6;
            }
            xmlBufCat(buf,pxVar1);
            (*xmlFree)(pxVar1);
          }
        }
      }
      else if (node->type == XML_ENTITY_REF_NODE) {
        if (escMode == 0) {
          xmlBufGetNodeContent(buf,node);
        }
        else {
          xmlBufAdd(buf,(xmlChar *)"&",1);
          xmlBufCat(buf,node->name);
          xmlBufAdd(buf,";",1);
        }
      }
    }
    pxVar1 = xmlBufDetach(buf);
    xmlBufFree(buf);
  }
  return pxVar1;
}

Assistant:

static xmlChar *
xmlNodeListGetStringInternal(xmlDocPtr doc, const xmlNode *node, int escMode) {
    xmlBufPtr buf;
    xmlChar *ret;

    if (node == NULL)
        return(xmlStrdup(BAD_CAST ""));

    if ((escMode == 0) &&
        ((node->type == XML_TEXT_NODE) ||
         (node->type == XML_CDATA_SECTION_NODE)) &&
        (node->next == NULL)) {
        if (node->content == NULL)
            return(xmlStrdup(BAD_CAST ""));
        return(xmlStrdup(node->content));
    }

    buf = xmlBufCreate(50);
    if (buf == NULL)
        return(NULL);

    while (node != NULL) {
        if ((node->type == XML_TEXT_NODE) ||
            (node->type == XML_CDATA_SECTION_NODE)) {
            if (node->content != NULL) {
                if (escMode == 0) {
                    xmlBufCat(buf, node->content);
                } else {
                    xmlChar *encoded;

                    if (escMode == 1)
                        encoded = xmlEncodeEntitiesInternal(doc, node->content,
                                                            0);
                    else if (escMode == 2)
                        encoded = xmlEncodeEntitiesInternal(doc, node->content,
                                                            XML_ESCAPE_ATTR);
                    else
                        encoded = xmlEncodeSpecialChars(doc, node->content);
                    if (encoded == NULL)
                        goto error;
                    xmlBufCat(buf, encoded);
                    xmlFree(encoded);
                }
            }
        } else if (node->type == XML_ENTITY_REF_NODE) {
            if (escMode == 0) {
                xmlBufGetNodeContent(buf, node);
            } else {
                xmlBufAdd(buf, BAD_CAST "&", 1);
                xmlBufCat(buf, node->name);
                xmlBufAdd(buf, BAD_CAST ";", 1);
            }
        }

        node = node->next;
    }

    ret = xmlBufDetach(buf);
    xmlBufFree(buf);
    return(ret);

error:
    xmlBufFree(buf);
    return(NULL);
}